

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsSendQueue.cpp
# Opt level: O3

void __thiscall Scs::SendQueue::Push(SendQueue *this,void *data,size_t bytes)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  BufferPtr buffer;
  undefined4 local_60;
  undefined4 local_5c;
  pthread_mutex_t *local_58;
  value_type local_50;
  size_t local_40;
  SendQueue *local_38;
  
  local_58 = (pthread_mutex_t *)&this->m_mutex;
  local_38 = this;
  iVar1 = pthread_mutex_lock(local_58);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  uVar3 = bytes + 8;
  local_40 = bytes;
  if (uVar3 != 0) {
    bVar4 = true;
    do {
      uVar2 = 0x10000;
      if (uVar3 < 0x10000) {
        uVar2 = uVar3;
      }
      CreateBuffer();
      if (bVar4) {
        if (0xfffffffe < local_40) {
          __assert_fail("bytes < 0xFFFFFFFF",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JamesBoer[P]Scs/Source/ScsSendQueue.cpp"
                        ,0x45,"void Scs::SendQueue::Push(const void *, size_t)");
        }
        local_60 = 0x6d736373;
        local_5c = (undefined4)local_40;
        std::vector<unsigned_char,Scs::Allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
                  ((vector<unsigned_char,Scs::Allocator<unsigned_char>> *)
                   local_50.
                   super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,*(undefined8 *)
                            ((long)local_50.
                                   super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + 8),&local_60,&local_58);
        uVar3 = uVar3 - 8;
        uVar2 = uVar2 - 8;
      }
      std::vector<unsigned_char,Scs::Allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
                ((vector<unsigned_char,Scs::Allocator<unsigned_char>> *)
                 local_50.
                 super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,*(undefined8 *)
                          ((long)local_50.
                                 super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 8),data,(void *)((long)data + uVar2));
      std::
      deque<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
      ::push_back(&local_38->m_queue,&local_50);
      if (local_50.
          super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.
                   super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      bVar4 = false;
      uVar3 = uVar3 - uVar2;
      data = (void *)((long)data + uVar2);
    } while (uVar3 != 0);
  }
  pthread_mutex_unlock(local_58);
  return;
}

Assistant:

void SendQueue::Push(const void * data, size_t bytes)
{
	std::lock_guard<std::mutex> lock(m_mutex);

	// Track data and bytes remaining to queue
	uint8_t * ptrData = (uint8_t *)data;
	size_t bytesRemaining = bytes + sizeof(MessageHeader);
	bool firstWrite = true;
	while (bytesRemaining)
	{
		size_t bytesToWrite = std::min(bytesRemaining, SEND_BUFFER_SIZE);
		BufferPtr buffer = CreateBuffer();
		if (firstWrite)
		{
			// Single message sizes over 4GB aren't supported, which is a
			// ridiculous size for a single TCP/IP message anyhow.
			assert(bytes < 0xFFFFFFFF);
			MessageHeader header;
			header.size = static_cast<uint32_t>(bytes);	
			buffer->insert(buffer->end(), reinterpret_cast<uint8_t *>(&header), reinterpret_cast<uint8_t *>(&header) + sizeof(MessageHeader));
			bytesRemaining -= sizeof(MessageHeader);
			bytesToWrite -= sizeof(MessageHeader);
			firstWrite = false;
		}
		buffer->insert(buffer->end(), ptrData, ptrData + bytesToWrite);
		m_queue.push_back(buffer);
		ptrData += bytesToWrite;
		bytesRemaining -= bytesToWrite;
	}
	assert(bytesRemaining == 0);
}